

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_nonce_gen
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uchar *session_secrand32,uchar *seckey,
              secp256k1_pubkey *pubkey,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  byte *pbVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  uint uVar8;
  long lVar9;
  uchar *p;
  byte bVar10;
  uint uVar11;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  undefined1 auVar12 [16];
  uchar acc;
  int ret;
  secp256k1_pubkey *local_78;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  
  ret = 1;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_musig_nonce_gen_cold_4();
  }
  else if (secnonce != (secp256k1_musig_secnonce *)0x0) {
    local_78 = pubkey;
    memset(secnonce,0,0x84);
    if (session_secrand32 == (uchar *)0x0) {
      secp256k1_musig_nonce_gen_cold_2();
      return 0;
    }
    bVar10 = 0;
    bVar13 = 0;
    bVar14 = 0;
    bVar15 = 0;
    bVar16 = 0;
    bVar17 = 0;
    bVar18 = 0;
    bVar19 = 0;
    bVar20 = 0;
    bVar21 = 0;
    bVar22 = 0;
    bVar23 = 0;
    bVar24 = 0;
    bVar25 = 0;
    bVar26 = 0;
    bVar27 = 0;
    lVar9 = 0;
    do {
      pbVar1 = session_secrand32 + lVar9;
      bVar10 = bVar10 | *pbVar1;
      bVar13 = bVar13 | pbVar1[1];
      bVar14 = bVar14 | pbVar1[2];
      bVar15 = bVar15 | pbVar1[3];
      bVar16 = bVar16 | pbVar1[4];
      bVar17 = bVar17 | pbVar1[5];
      bVar18 = bVar18 | pbVar1[6];
      bVar19 = bVar19 | pbVar1[7];
      bVar20 = bVar20 | pbVar1[8];
      bVar21 = bVar21 | pbVar1[9];
      bVar22 = bVar22 | pbVar1[10];
      bVar23 = bVar23 | pbVar1[0xb];
      bVar24 = bVar24 | pbVar1[0xc];
      bVar25 = bVar25 | pbVar1[0xd];
      bVar26 = bVar26 | pbVar1[0xe];
      bVar27 = bVar27 | pbVar1[0xf];
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x20);
    auVar12[0] = -(bVar10 == 0);
    auVar12[1] = -(bVar13 == 0);
    auVar12[2] = -(bVar14 == 0);
    auVar12[3] = -(bVar15 == 0);
    auVar12[4] = -(bVar16 == 0);
    auVar12[5] = -(bVar17 == 0);
    auVar12[6] = -(bVar18 == 0);
    auVar12[7] = -(bVar19 == 0);
    auVar12[8] = -(bVar20 == 0);
    auVar12[9] = -(bVar21 == 0);
    auVar12[10] = -(bVar22 == 0);
    auVar12[0xb] = -(bVar23 == 0);
    auVar12[0xc] = -(bVar24 == 0);
    auVar12[0xd] = -(bVar25 == 0);
    auVar12[0xe] = -(bVar26 == 0);
    auVar12[0xf] = -(bVar27 == 0);
    _zzq_args[1] = (unsigned_long)&acc;
    acc = '\0';
    _zzq_args[0] = 0x4d430001;
    _zzq_args[2] = 1;
    _zzq_args[3] = 0;
    _zzq_args[4] = 0;
    _zzq_args[5] = 0;
    ret = ret & 1;
    _zzq_result = 0;
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
                ) == 0xffff) {
      ret = 0;
    }
    if (ctx->declassify != 0) {
      secp256k1_musig_nonce_gen_cold_1();
    }
    if (ret == 0) {
      secp256k1_musig_secnonce_invalidate(ctx,secnonce,1);
      return 0;
    }
    uVar8 = secp256k1_musig_nonce_gen_internal
                      (ctx,secnonce,pubnonce,session_secrand32,seckey,local_78,msg32,keyagg_cache,
                       extra_input32);
    cVar7 = (char)(uVar8 & ret) + -1;
    auVar12 = ZEXT216(CONCAT11(cVar7,cVar7));
    auVar12 = pshuflw(auVar12,auVar12,0);
    uVar11 = auVar12._0_4_;
    lVar9 = 0;
    do {
      puVar2 = (uint *)(session_secrand32 + lVar9);
      uVar4 = puVar2[1];
      uVar5 = puVar2[2];
      uVar6 = puVar2[3];
      puVar3 = (uint *)(session_secrand32 + lVar9);
      *puVar3 = *puVar2 & uVar11;
      puVar3[1] = uVar4 & uVar11;
      puVar3[2] = uVar5 & uVar11;
      puVar3[3] = uVar6 & uVar11;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x20);
    return uVar8 & ret;
  }
  secp256k1_musig_nonce_gen_cold_3();
  return 0;
}

Assistant:

int secp256k1_musig_nonce_gen(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, unsigned char *session_secrand32, const unsigned char *seckey, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secnonce != NULL);
    memset(secnonce, 0, sizeof(*secnonce));
    ARG_CHECK(session_secrand32 != NULL);

    /* Check in constant time that the session_secrand32 is not 0 as a
     * defense-in-depth measure that may protect against a faulty RNG. */
    ret &= !secp256k1_is_zero_array(session_secrand32, 32);

    /* We can declassify because branching on ret is only relevant when this
     * function called with an invalid session_secrand32 argument */
    secp256k1_declassify(ctx, &ret, sizeof(ret));
    if (ret == 0) {
        secp256k1_musig_secnonce_invalidate(ctx, secnonce, 1);
        return 0;
    }

    ret &= secp256k1_musig_nonce_gen_internal(ctx, secnonce, pubnonce, session_secrand32, seckey, pubkey, msg32, keyagg_cache, extra_input32);

    /* Set the session_secrand32 buffer to zero to prevent the caller from using
     * nonce_gen multiple times with the same buffer. */
    secp256k1_memczero(session_secrand32, 32, ret);
    return ret;
}